

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool dxil_spv::Converter::entry_point_matches(String *mangled,char *user)

{
  bool bVar1;
  String local_40;
  char *local_20;
  char *user_local;
  String *mangled_local;
  
  local_20 = user;
  user_local = (char *)mangled;
  bVar1 = is_mangled_entry_point(user);
  if (bVar1) {
    mangled_local._7_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                          *)user_local,local_20);
  }
  else {
    demangle_entry_point(&local_40,(String *)user_local);
    mangled_local._7_1_ = std::operator==(&local_40,local_20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_40);
  }
  return (bool)(mangled_local._7_1_ & 1);
}

Assistant:

bool Converter::entry_point_matches(const String &mangled, const char *user)
{
	if (is_mangled_entry_point(user))
		return mangled == user;
	else
		return demangle_entry_point(mangled) == user;
}